

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<std::pair<QString,QFileInfo>>::emplace<std::pair<QString,QFileInfo>>
          (QMovableArrayOps<std::pair<QString,QFileInfo>> *this,qsizetype i,
          pair<QString,_QFileInfo> *args)

{
  undefined8 *puVar1;
  int *piVar2;
  long lVar3;
  ulong uVar4;
  Data *pDVar5;
  char16_t *pcVar6;
  qsizetype qVar7;
  QArrayData *pQVar8;
  pair<QString,_QFileInfo> *__dest;
  long lVar9;
  long in_FS_OFFSET;
  Inserter local_80;
  QArrayData *local_58;
  char16_t *pcStack_50;
  qsizetype local_48;
  undefined1 *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  piVar2 = *(int **)this;
  if ((piVar2 == (int *)0x0) || (1 < *piVar2)) {
LAB_0060f7fa:
    local_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = &((args->first).d.d)->super_QArrayData;
    pcStack_50 = (args->first).d.ptr;
    (args->first).d.d = (Data *)0x0;
    (args->first).d.ptr = (char16_t *)0x0;
    local_48 = (args->first).d.size;
    (args->first).d.size = 0;
    QFileInfo::QFileInfo((QFileInfo *)&local_40,&args->second);
    lVar3 = *(long *)(this + 0x10);
    QArrayDataPointer<std::pair<QString,_QFileInfo>_>::detachAndGrow
              ((QArrayDataPointer<std::pair<QString,_QFileInfo>_> *)this,
               (uint)(i == 0 && lVar3 != 0),1,(pair<QString,_QFileInfo> **)0x0,
               (QArrayDataPointer<std::pair<QString,_QFileInfo>_> *)0x0);
    qVar7 = local_48;
    pcVar6 = pcStack_50;
    pQVar8 = local_58;
    if (i == 0 && lVar3 != 0) {
      lVar3 = *(long *)(this + 8);
      local_58 = (QArrayData *)0x0;
      *(QArrayData **)(lVar3 + -0x20) = pQVar8;
      pcStack_50 = (char16_t *)0x0;
      *(char16_t **)(lVar3 + -0x18) = pcVar6;
      local_48 = 0;
      *(qsizetype *)(lVar3 + -0x10) = qVar7;
      QFileInfo::QFileInfo((QFileInfo *)(lVar3 + -8),(QFileInfo *)&local_40);
      *(long *)(this + 8) = *(long *)(this + 8) + -0x20;
      *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
    }
    else {
      lVar3 = *(long *)(this + 8);
      lVar9 = i * 0x20;
      puVar1 = (undefined8 *)(lVar9 + lVar3);
      __dest = (pair<QString,_QFileInfo> *)(puVar1 + 4);
      local_80.nInserts = 1;
      local_80.bytes = (*(long *)(this + 0x10) - i) * 0x20;
      local_80.data = (QArrayDataPointer<std::pair<QString,_QFileInfo>_> *)this;
      local_80.displaceTo = __dest;
      memmove(__dest,(void *)(lVar9 + lVar3),local_80.bytes);
      qVar7 = local_48;
      pcVar6 = pcStack_50;
      pQVar8 = local_58;
      local_58 = (QArrayData *)0x0;
      *puVar1 = pQVar8;
      pcStack_50 = (char16_t *)0x0;
      puVar1[1] = pcVar6;
      local_48 = 0;
      puVar1[2] = qVar7;
      QFileInfo::QFileInfo((QFileInfo *)(lVar9 + lVar3 + 0x18),(QFileInfo *)&local_40);
      local_80.displaceFrom = __dest;
      QMovableArrayOps<std::pair<QString,_QFileInfo>_>::Inserter::~Inserter(&local_80);
    }
    QFileInfo::~QFileInfo((QFileInfo *)&local_40);
    if (local_58 != (QArrayData *)0x0) {
      LOCK();
      (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_58,2,0x10);
      }
    }
  }
  else {
    if ((*(long *)(this + 0x10) == i) &&
       (lVar3 = *(long *)(this + 8),
       *(long *)(piVar2 + 2) !=
       ((long)(lVar3 - ((long)piVar2 + 0x1fU & 0xfffffffffffffff0)) >> 5) + i)) {
      pDVar5 = (args->first).d.d;
      (args->first).d.d = (Data *)0x0;
      puVar1 = (undefined8 *)(lVar3 + i * 0x20);
      *puVar1 = pDVar5;
      pcVar6 = (args->first).d.ptr;
      (args->first).d.ptr = (char16_t *)0x0;
      puVar1[1] = pcVar6;
      qVar7 = (args->first).d.size;
      (args->first).d.size = 0;
      puVar1[2] = qVar7;
      QFileInfo::QFileInfo((QFileInfo *)(puVar1 + 3),&args->second);
    }
    else {
      if ((i != 0) ||
         (uVar4 = *(ulong *)(this + 8), ((long)piVar2 + 0x1fU & 0xfffffffffffffff0) == uVar4))
      goto LAB_0060f7fa;
      pDVar5 = (args->first).d.d;
      (args->first).d.d = (Data *)0x0;
      *(Data **)(uVar4 - 0x20) = pDVar5;
      pcVar6 = (args->first).d.ptr;
      (args->first).d.ptr = (char16_t *)0x0;
      *(char16_t **)(uVar4 - 0x18) = pcVar6;
      qVar7 = (args->first).d.size;
      (args->first).d.size = 0;
      *(qsizetype *)(uVar4 - 0x10) = qVar7;
      QFileInfo::QFileInfo((QFileInfo *)(uVar4 - 8),&args->second);
      *(long *)(this + 8) = *(long *)(this + 8) + -0x20;
    }
    *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }